

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref__data_source_on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_channel *in_R8;
  size_t in_R9;
  ma_audio_buffer_ref *pAudioBufferRef;
  
  *in_RSI = *(undefined4 *)(in_RDI + 0x48);
  *in_RDX = *(undefined4 *)(in_RDI + 0x4c);
  *in_RCX = *(undefined4 *)(in_RDI + 0x50);
  ma_channel_map_init_standard
            ((ma_standard_channel_map)((ulong)in_RCX >> 0x20),in_R8,in_R9,
             (ma_uint32)((ulong)in_RDI >> 0x20));
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_audio_buffer_ref__data_source_on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_audio_buffer_ref* pAudioBufferRef = (ma_audio_buffer_ref*)pDataSource;

    *pFormat     = pAudioBufferRef->format;
    *pChannels   = pAudioBufferRef->channels;
    *pSampleRate = pAudioBufferRef->sampleRate;
    ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pAudioBufferRef->channels);

    return MA_SUCCESS;
}